

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ValidateProto3ClosedEnum_Test::TestBody
          (ValidationErrorTest_ValidateProto3ClosedEnum_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_70
  ;
  allocator<char> local_41;
  string local_40;
  string_view local_20;
  ValidationErrorTest_ValidateProto3ClosedEnum_Test *local_10;
  ValidationErrorTest_ValidateProto3ClosedEnum_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "name: \'foo.proto\'\n                 package: \'foo\'\n                 syntax: \'editions\'\n                 edition: EDITION_2023\n                 enum_type {\n                   name: \'FooEnum\'\n                   value { name: \'DEFAULT_OPTION\' number: 0 }\n                   options { features { enum_type: CLOSED } }\n                 }"
            );
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "name: \'bar.proto\'\n           dependency: \'foo.proto\'\n           syntax: \'proto3\'\n           message_type {\n             name: \'Foo\'\n             field {\n               name: \'bar\'\n               number: 1\n               label: LABEL_OPTIONAL\n               type: TYPE_ENUM\n               type_name: \'foo.FooEnum\'\n             }\n           }"
             ,&local_41);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_70,
            "bar.proto: Foo.bar: TYPE: Enum type \"foo.FooEnum\" is not an open enum, but is used in \"Foo\" which is a proto3 message type.\n"
           );
  ValidationErrorTest::BuildFileWithErrors(&this->super_ValidationErrorTest,&local_40,&local_70);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ValidateProto3ClosedEnum) {
  // Define a closed enum in an editions file.
  BuildFile(R"pb(name: 'foo.proto'
                 package: 'foo'
                 syntax: 'editions'
                 edition: EDITION_2023
                 enum_type {
                   name: 'FooEnum'
                   value { name: 'DEFAULT_OPTION' number: 0 }
                   options { features { enum_type: CLOSED } }
                 })pb");

  BuildFileWithErrors(
      R"pb(name: 'bar.proto'
           dependency: 'foo.proto'
           syntax: 'proto3'
           message_type {
             name: 'Foo'
             field {
               name: 'bar'
               number: 1
               label: LABEL_OPTIONAL
               type: TYPE_ENUM
               type_name: 'foo.FooEnum'
             }
           })pb",
      "bar.proto: Foo.bar: TYPE: Enum type \"foo.FooEnum\" is not an open "
      "enum, but is used in \"Foo\" which is a proto3 message type.\n");
}